

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O0

InlineReader * __thiscall adios2::core::engine::InlineWriter::GetReader(InlineWriter *this)

{
  Mode MVar1;
  size_type sVar2;
  element_type *this_00;
  element_type *peVar3;
  long in_RDI;
  InlineReader *reader;
  shared_ptr<adios2::core::Engine> e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *engine_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *in_stack_fffffffffffffe08;
  shared_ptr<adios2::core::Engine> *in_stack_fffffffffffffe10;
  allocator *paVar4;
  InlineReader *local_1d0;
  undefined8 in_stack_fffffffffffffe50;
  int commRank;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  InlineReader *local_f0;
  _Base_ptr local_e0;
  __shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2> local_d8;
  allocator local_c1;
  string local_c0 [39];
  undefined1 local_99 [40];
  undefined1 local_71 [56];
  undefined1 local_39 [33];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *local_18;
  InlineReader *local_8;
  
  commRank = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_18 = IO::GetEngines_abi_cxx11_(*(IO **)(in_RDI + 0x28));
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                  *)0xabf6e5);
  if (sVar2 == 1) {
    local_8 = (InlineReader *)0x0;
  }
  else {
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
            ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                    *)0xabf709);
    if (2 < sVar2) {
      in_stack_fffffffffffffe68 = (string *)local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_39 + 1),"Engine",(allocator *)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe60 = (string *)local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_71 + 1),"InlineWriter",(allocator *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe58 = (string *)local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_99 + 1),"GetReader",(allocator *)in_stack_fffffffffffffe58);
      paVar4 = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"There must be only one inline writer and at most one inline reader.",
                 paVar4);
      commRank = (int)((ulong)paVar4 >> 0x20);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,commRank);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string((string *)(local_99 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_99);
      std::__cxx11::string::~string((string *)(local_71 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_71);
      std::__cxx11::string::~string((string *)(local_39 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_39);
    }
    local_e0 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
               ::begin(in_stack_fffffffffffffe08);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                  *)in_stack_fffffffffffffe10);
    std::shared_ptr<adios2::core::Engine>::shared_ptr
              (in_stack_fffffffffffffe10,
               (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffffe08);
    this_00 = std::
              __shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0xabf985);
    MVar1 = Engine::OpenMode(this_00);
    if (MVar1 == Write) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
      ::rbegin(in_stack_fffffffffffffe08);
      std::
      reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
      ::operator->((reverse_iterator<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
                    *)in_stack_fffffffffffffe10);
      std::shared_ptr<adios2::core::Engine>::operator=
                (in_stack_fffffffffffffe10,
                 (shared_ptr<adios2::core::Engine> *)in_stack_fffffffffffffe08);
    }
    peVar3 = std::__shared_ptr<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2>::get(&local_d8);
    if (peVar3 == (element_type *)0x0) {
      local_1d0 = (InlineReader *)0x0;
    }
    else {
      local_1d0 = (InlineReader *)__dynamic_cast(peVar3,&Engine::typeinfo,&InlineReader::typeinfo,0)
      ;
    }
    local_f0 = local_1d0;
    if (local_1d0 == (InlineReader *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"Engine",&local_111);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"InlineWriter",&local_139);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"GetReader",&local_161);
      paVar4 = (allocator *)&stack0xfffffffffffffe77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_188,"dynamic_cast<InlineReader*> failed; this is very likely a bug.",paVar4);
      helper::Throw<std::runtime_error>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,commRank);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    local_8 = local_f0;
    std::shared_ptr<adios2::core::Engine>::~shared_ptr((shared_ptr<adios2::core::Engine> *)0xabfc7d)
    ;
  }
  return local_8;
}

Assistant:

const InlineReader *InlineWriter::GetReader() const
{
    const auto &engine_map = m_IO.GetEngines();
    if (engine_map.size() == 1)
    {
        // it should be fine for a writer to be created and start running,
        // without the reader having been created. This is necessary to run
        // correctly with ParaView Catalyst Live.
        return nullptr;
    }
    else if (engine_map.size() > 2)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineWriter", "GetReader",
                                          "There must be only one inline writer and at most "
                                          "one inline reader.");
    }

    std::shared_ptr<Engine> e = engine_map.begin()->second;
    if (e->OpenMode() == adios2::Mode::Write)
    {
        e = engine_map.rbegin()->second;
    }

    const auto reader = dynamic_cast<InlineReader *>(e.get());
    if (!reader)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "InlineWriter", "GetReader",
            "dynamic_cast<InlineReader*> failed; this is very likely a bug.");
    }
    return reader;
}